

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

uint16_t bf_peek_uint16_be(bfile_t *bfile)

{
  uint16_t uVar1;
  int iVar2;
  
  if ((bfile->pos % (ulong)bfile->buffer_size == 0) && (bfile->pos == bfile->ipos)) {
    bf_read_buffer(bfile);
  }
  if (bfile->ipos - 2 < bfile->pos) {
    bf_peek_uint16_be_cold_1();
    uVar1 = 0;
  }
  else {
    iVar2 = (int)(bfile->pos % (ulong)bfile->buffer_size);
    uVar1 = CONCAT11(bfile->buffer[iVar2],bfile->buffer[(int)((iVar2 + 1U) % bfile->buffer_size)]);
  }
  return uVar1;
}

Assistant:

uint16_t
bf_peek_uint16_be(
    bfile_t * bfile )
{
    uint16_t value;
    int bufoff;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    bufoff = bfile->pos % bfile->buffer_size;
    if ( (bufoff == 0) && (bfile->pos == bfile->ipos) )
        bf_read_buffer( bfile );

    if ( bfile->pos > (bfile->ipos - 2) ) {
        fprintf( stderr,
            "bfile warning: could not peek on next uint16.\n" );
        return 0;
    }

    bufoff = bfile->pos % bfile->buffer_size;
    value = bfile->buffer[bufoff] << 8;
    bufoff = (bufoff + 1) % bfile->buffer_size;
    value = value | bfile->buffer[bufoff];

    return value;
}